

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampTest::TextureBorderClampTest
          (TextureBorderClampTest *this,Context *context,char *name,char *description,
          deUint32 texFormat,DepthStencilMode mode,StateType stateType,int texWidth,int texHeight,
          SamplingFunction samplingFunction,deUint32 flags)

{
  TestLog *log;
  TextureChannelClass TVar1;
  string local_48;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,name,SSBOArrayLengthTests::init::arraysSized + 1);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureBorderClampTest_00b4f380;
  this->m_texFormat = (deUint32)description;
  this->m_sampleMode = texFormat;
  TVar1 = getFormatChannelClass((deUint32)description,texFormat);
  this->m_channelClass = TVar1;
  this->m_stateType = mode;
  this->m_texHeight = texWidth;
  this->m_texWidth = stateType;
  this->m_samplingFunction = texHeight;
  this->m_useShadowSampler = (bool)((byte)samplingFunction & 1);
  (this->m_texture).super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr
       = (Texture2D *)0x0;
  (this->m_renderer).
  super_UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
  .m_data.ptr = (TextureRenderer *)0x0;
  (this->m_gatherProgram).
  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr =
       (ShaderProgram *)0x0;
  this->m_iterationNdx = 0;
  log = context->m_testCtx->m_log;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,0x98644f);
  tcu::ResultCollector::ResultCollector(&this->m_result,log,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TextureBorderClampTest::TextureBorderClampTest (Context&						context,
												const char*						name,
												const char*						description,
												deUint32						texFormat,
												tcu::Sampler::DepthStencilMode	mode,
												StateType						stateType,
												int								texWidth,
												int								texHeight,
												SamplingFunction				samplingFunction,
												deUint32						flags)
	: TestCase				(context, name, description)
	, m_texFormat			(texFormat)
	, m_sampleMode			(mode)
	, m_channelClass		(getFormatChannelClass(texFormat, mode))
	, m_stateType			(stateType)
	, m_texHeight			(texHeight)
	, m_texWidth			(texWidth)
	, m_samplingFunction	(samplingFunction)
	, m_useShadowSampler	((flags & FLAG_USE_SHADOW_SAMPLER) != 0)
	, m_iterationNdx		(0)
	, m_result				(context.getTestContext().getLog())
{
	DE_ASSERT(stateType < STATE_LAST);
	DE_ASSERT(samplingFunction < SAMPLE_LAST);
	// mode must be set for combined depth-stencil formats
	DE_ASSERT(m_channelClass != tcu::TEXTURECHANNELCLASS_LAST || mode != tcu::Sampler::MODE_LAST);
}